

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode http_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  uint uVar5;
  
  if ((cf->field_0x24 & 1) == 0) {
    plVar1 = (long *)cf->ctx;
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    do {
      CVar3 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (*done != true) {
        return CURLE_OK;
      }
      *done = false;
      if (*plVar1 != 0) {
        CVar3 = CURLE_OK;
        goto LAB_00641ff2;
      }
      _Var2 = Curl_conn_cf_is_ssl(cf->next);
      uVar5 = 2;
      if (_Var2) {
        uVar5 = (uint)cf->conn->proxy_alpn;
      }
      if (uVar5 < 3) {
        if (data != (Curl_easy *)0x0) {
          if (((cf != (Curl_cfilter *)0x0) &&
              ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level))
          {
            Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/1.1");
          }
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"CONNECT tunnel: HTTP/1.%d negotiated",(ulong)(uVar5 != 1));
          }
        }
        CVar3 = Curl_cf_h1_proxy_insert_after(cf,data);
LAB_00641f8c:
        if (CVar3 == CURLE_OK) {
          *plVar1 = (long)cf->next;
          iVar4 = 4;
          CVar3 = CURLE_OK;
        }
        else {
          iVar4 = 10;
        }
      }
      else {
        if (uVar5 == 3) {
          if (data != (Curl_easy *)0x0) {
            if (((cf != (Curl_cfilter *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
               (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/2");
            }
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"CONNECT tunnel: HTTP/2 negotiated");
            }
          }
          CVar3 = Curl_cf_h2_proxy_insert_after(cf,data);
          goto LAB_00641f8c;
        }
        iVar4 = 10;
        CVar3 = CURLE_COULDNT_CONNECT;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"CONNECT tunnel: unsupported ALPN(%d) negotiated",(ulong)uVar5);
        }
      }
    } while (iVar4 == 4);
    if (iVar4 != 10) {
      return CURLE_OK;
    }
LAB_00641ff2:
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    cf->field_0x24 = cf->field_0x24 | 1;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

static CURLcode http_proxy_cf_connect(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      bool blocking, bool *done)
{
  struct cf_proxy_ctx *ctx = cf->ctx;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
connect_sub:
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ctx->cf_protocol) {
    struct Curl_cfilter *cf_protocol = NULL;
    int alpn = Curl_conn_cf_is_ssl(cf->next)?
      cf->conn->proxy_alpn : CURL_HTTP_VERSION_1_1;

    /* First time call after the subchain connected */
    switch(alpn) {
    case CURL_HTTP_VERSION_NONE:
    case CURL_HTTP_VERSION_1_0:
    case CURL_HTTP_VERSION_1_1:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/1.1");
      infof(data, "CONNECT tunnel: HTTP/1.%d negotiated",
            (alpn == CURL_HTTP_VERSION_1_0)? 0 : 1);
      result = Curl_cf_h1_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#ifdef USE_NGHTTP2
    case CURL_HTTP_VERSION_2:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/2");
      infof(data, "CONNECT tunnel: HTTP/2 negotiated");
      result = Curl_cf_h2_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#endif
    default:
      infof(data, "CONNECT tunnel: unsupported ALPN(%d) negotiated", alpn);
      result = CURLE_COULDNT_CONNECT;
      goto out;
    }

    ctx->cf_protocol = cf_protocol;
    /* after we installed the filter "below" us, we call connect
     * on out sub-chain again.
     */
    goto connect_sub;
  }
  else {
    /* subchain connected and we had already installed the protocol filter.
     * This means the protocol tunnel is established, we are done.
     */
    DEBUGASSERT(ctx->cf_protocol);
    result = CURLE_OK;
  }

out:
  if(!result) {
    cf->connected = TRUE;
    *done = TRUE;
  }
  return result;
}